

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O2

void destroy_node(adh_node_t *node)

{
  if (node != (adh_node_t *)0x0) {
    if (node->left != (adh_node_t *)0x0) {
      destroy_node(node->left);
      node->left = (adh_node *)0x0;
    }
    if (node->right != (adh_node_t *)0x0) {
      destroy_node(node->right);
    }
    free(node);
    return;
  }
  return;
}

Assistant:

void destroy_node(adh_node_t *node) {
    if(node == NULL)
        return;

#ifdef _DEBUG
    log_trace(" destroy_node", "%s\n", fmt_node(node));
#endif

    if(node->left != NULL) {
        destroy_node(node->left);
        node->left = NULL;
    }

    if(node->right != NULL) {
        destroy_node(node->right);
        node->right = NULL;
    }

    free(node);
}